

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

double P_GetFriction(AActor *mo,double *frictionfactor)

{
  uint uVar1;
  extsector_t *peVar2;
  F3DFloor *pFVar3;
  msecnode_t *pmVar4;
  sector_t_conflict *this;
  double dVar5;
  double dVar6;
  bool bVar7;
  int iVar8;
  sector_t_conflict *psVar9;
  ulong uVar10;
  msecnode_t **ppmVar11;
  uint i;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  double dVar12;
  double movefactor;
  double newmf;
  DVector3 pos;
  undefined1 local_98 [16];
  double local_88;
  double local_80;
  DVector2 local_78;
  DVector2 local_68;
  DVector3 local_58;
  double *local_40;
  double local_38;
  
  local_88 = 0.03125;
  bVar7 = AActor::IsNoClip2(mo);
  local_98._0_8_ = 0.90625;
  if (!bVar7) {
    uVar1 = (mo->flags).Value;
    if ((uVar1 >> 9 & 1) == 0 || ((mo->flags2).Value & 0x10) == 0) {
      if (((uVar1 >> 9 & 1) == 0 && 1 < mo->waterlevel) ||
         ((mo->waterlevel == 1 && (mo->floorz + 6.0 < (mo->__Pos).Z)))) {
        uVar10 = 0;
        dVar12 = sector_t::GetFriction(mo->Sector,0,&local_88);
        local_98._8_4_ = extraout_XMM0_Dc;
        local_98._0_8_ = dVar12;
        local_98._12_4_ = extraout_XMM0_Dd;
        local_88 = local_88 * 0.5;
        while( true ) {
          peVar2 = mo->Sector->e;
          if ((peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count <= uVar10) break;
          pFVar3 = (peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar10];
          if ((((~pFVar3->flags & 0x11) == 0) &&
              (dVar12 = (mo->__Pos).Z, dVar5 = secplane_t::ZatPoint((pFVar3->top).plane,mo),
              dVar12 <= dVar5)) &&
             (dVar12 = (mo->__Pos).Z, dVar5 = secplane_t::ZatPoint((pFVar3->bottom).plane,mo),
             dVar5 <= dVar12)) {
            dVar12 = sector_t::GetFriction(pFVar3->model,(pFVar3->top).isceiling,&local_80);
            if ((((double)local_98._0_8_ == 0.90625) && (!NAN((double)local_98._0_8_))) ||
               (dVar12 < (double)local_98._0_8_)) {
              local_88 = local_80 * 0.5;
              local_98._8_4_ = extraout_XMM0_Dc_00;
              local_98._0_8_ = dVar12;
              local_98._12_4_ = extraout_XMM0_Dd_00;
            }
          }
          uVar10 = uVar10 + 1;
        }
      }
      else if (((uVar1 & 0x1200) == 0) && (var_friction.Value != false)) {
        ppmVar11 = &mo->touching_sectorlist;
        local_98 = ZEXT816(0x3fed000000000000);
        local_40 = frictionfactor;
        while( true ) {
          pmVar4 = *ppmVar11;
          frictionfactor = local_40;
          if (pmVar4 == (msecnode_t *)0x0) break;
          this = pmVar4->m_sector;
          AActor::PosRelative(&local_58,mo,(sector_t *)this);
          uVar10 = 0;
          while( true ) {
            if ((this->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count <= uVar10)
            break;
            pFVar3 = (this->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar10];
            uVar1 = pFVar3->flags;
            if ((uVar1 & 1) != 0) {
              if ((uVar1 & 2) == 0) {
                if ((uVar1 & 0x10) != 0) {
                  dVar12 = (mo->__Pos).Z;
                  local_68.X = local_58.X;
                  local_68.Y = local_58.Y;
                  dVar5 = secplane_t::ZatPoint((pFVar3->top).plane,&local_68);
                  if (dVar12 <= dVar5) {
                    dVar12 = (mo->__Pos).Z;
                    dVar5 = mo->Height;
                    local_78.X = local_58.X;
                    local_78.Y = local_58.Y;
                    dVar6 = secplane_t::ZatPoint((pFVar3->bottom).plane,&local_78);
                    if (dVar6 <= dVar12 + dVar5) goto LAB_00413338;
                  }
                }
              }
              else {
                local_68.X = local_58.X;
                local_68.Y = local_58.Y;
                dVar12 = secplane_t::ZatPoint((pFVar3->top).plane,&local_68);
                if (ABS((mo->__Pos).Z - dVar12) < 1.52587890625e-05) {
LAB_00413338:
                  dVar12 = sector_t::GetFriction(pFVar3->model,(pFVar3->top).isceiling,&local_80);
                  if ((((double)local_98._0_8_ == 0.90625) && (!NAN((double)local_98._0_8_))) ||
                     (dVar12 < (double)local_98._0_8_)) {
                    local_88 = local_80;
                    local_98._8_4_ = extraout_XMM0_Dc_01;
                    local_98._0_8_ = dVar12;
                    local_98._12_4_ = extraout_XMM0_Dd_01;
                  }
                }
              }
            }
            uVar10 = uVar10 + 1;
          }
          if ((this->Flags & 0x10) == 0) {
            iVar8 = sector_t::GetTerrain((sector_t *)this,0);
            if ((Terrains.Array[iVar8].Friction != 0.0) || (NAN(Terrains.Array[iVar8].Friction)))
            goto LAB_004133bc;
          }
          else {
LAB_004133bc:
            dVar12 = sector_t::GetFriction((sector_t *)this,0,&local_80);
            if ((((double)local_98._0_8_ == 0.90625) && (!NAN((double)local_98._0_8_))) ||
               (dVar12 < (double)local_98._0_8_)) {
              dVar5 = (mo->__Pos).Z;
              local_68.X = local_58.X;
              local_68.Y = local_58.Y;
              local_38 = dVar12;
              dVar12 = secplane_t::ZatPoint(&this->floorplane,&local_68);
              if (dVar5 <= dVar12) {
LAB_0041346c:
                local_88 = local_80;
                local_98._8_8_ = 0;
                local_98._0_8_ = local_38;
              }
              else {
                psVar9 = sector_t::GetHeightSec(this);
                if (psVar9 != (sector_t_conflict *)0x0) {
                  dVar12 = (mo->__Pos).Z;
                  local_78.X = local_58.X;
                  local_78.Y = local_58.Y;
                  dVar5 = secplane_t::ZatPoint(&this->heightsec->floorplane,&local_78);
                  if (dVar12 <= dVar5) goto LAB_0041346c;
                }
              }
            }
          }
          ppmVar11 = &pmVar4->m_tnext;
        }
      }
    }
    else {
      local_98._0_8_ = 0.91796875;
    }
  }
  dVar12 = mo->Friction;
  if ((dVar12 != 1.0) || (NAN(dVar12))) {
    local_98._0_8_ = (double)local_98._0_8_ * dVar12;
    dVar12 = 1.0;
    if ((double)local_98._0_8_ <= 1.0) {
      dVar12 = (double)local_98._0_8_;
    }
    local_98._0_8_ = -(ulong)(0.0 < (double)local_98._0_8_) & (ulong)dVar12;
    local_88 = FrictionToMoveFactor((double)local_98._0_8_);
  }
  if (frictionfactor != (double *)0x0) {
    *frictionfactor = local_88;
  }
  return (double)local_98._0_8_;
}

Assistant:

double P_GetFriction(const AActor *mo, double *frictionfactor)
{
	double friction = ORIG_FRICTION;
	double movefactor = ORIG_FRICTION_FACTOR;
	double newfriction;
	double newmf;

	const msecnode_t *m;
	sector_t *sec;

	if (mo->IsNoClip2())
	{
		// The default values are fine for noclip2 mode
	}
	else if (mo->flags2 & MF2_FLY && mo->flags & MF_NOGRAVITY)
	{
		friction = FRICTION_FLY;
	}
	else if ((!(mo->flags & MF_NOGRAVITY) && mo->waterlevel > 1) ||
		(mo->waterlevel == 1 && mo->Z() > mo->floorz+ 6))
	{
		friction = mo->Sector->GetFriction(sector_t::floor, &movefactor);
		movefactor *= 0.5;

		// Check 3D floors -- might be the source of the waterlevel
		for (unsigned i = 0; i < mo->Sector->e->XFloor.ffloors.Size(); i++)
		{
			F3DFloor *rover = mo->Sector->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_EXISTS)) continue;
			if (!(rover->flags & FF_SWIMMABLE)) continue;

			if (mo->Z() > rover->top.plane->ZatPoint(mo) ||
				mo->Z() < rover->bottom.plane->ZatPoint(mo))
				continue;

			newfriction = rover->model->GetFriction(rover->top.isceiling, &newmf);
			if (newfriction < friction || friction == ORIG_FRICTION)
			{
				friction = newfriction;
				movefactor = newmf * 0.5;
			}
		}
	}
	else if (var_friction && !(mo->flags & (MF_NOCLIP | MF_NOGRAVITY)))
	{	// When the object is straddling sectors with the same
		// floor height that have different frictions, use the lowest
		// friction value (muddy has precedence over icy).

		for (m = mo->touching_sectorlist; m; m = m->m_tnext)
		{
			sec = m->m_sector;
			DVector3 pos = mo->PosRelative(sec);

			// 3D floors must be checked, too
			for (unsigned i = 0; i < sec->e->XFloor.ffloors.Size(); i++)
			{
				F3DFloor *rover = sec->e->XFloor.ffloors[i];
				if (!(rover->flags & FF_EXISTS)) continue;

				if (rover->flags & FF_SOLID)
				{
					// Must be standing on a solid floor
					if (!mo->isAtZ(rover->top.plane->ZatPoint(pos))) continue;
				}
				else if (rover->flags & FF_SWIMMABLE)
				{
					// Or on or inside a swimmable floor (e.g. in shallow water)
					if (mo->Z() > rover->top.plane->ZatPoint(pos) ||
						(mo->Top()) < rover->bottom.plane->ZatPoint(pos))
						continue;
				}
				else
					continue;

				newfriction = rover->model->GetFriction(rover->top.isceiling, &newmf);
				if (newfriction < friction || friction == ORIG_FRICTION)
				{
					friction = newfriction;
					movefactor = newmf;
				}
			}

			if (!(sec->Flags & SECF_FRICTION) &&
				Terrains[sec->GetTerrain(sector_t::floor)].Friction == 0)
			{
				continue;
			}
			newfriction = sec->GetFriction(sector_t::floor, &newmf);
			if ((newfriction < friction || friction == ORIG_FRICTION) &&
				(mo->Z() <= sec->floorplane.ZatPoint(pos) ||
				(sec->GetHeightSec() != NULL &&
				mo->Z() <= sec->heightsec->floorplane.ZatPoint(pos))))
			{
				friction = newfriction;
				movefactor = newmf;
			}
		}
	}

	if (mo->Friction != 1)
	{
		friction = clamp((friction * mo->Friction), 0., 1.);
		movefactor = FrictionToMoveFactor(friction);
	}

	if (frictionfactor)
		*frictionfactor = movefactor;

	return friction;
}